

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2skin.cpp
# Opt level: O0

ObjPipeline * rw::ps2::makeSkinPipeline(void)

{
  uint32 bufferSize;
  MatPipeline *this;
  ObjPipeline *pOVar1;
  ObjPipeline *opipe;
  uint32 vertCount;
  MatPipeline *pipe;
  
  this = MatPipeline::create();
  (this->super_Pipeline).pluginID = 0x116;
  (this->super_Pipeline).pluginData = 1;
  this->attribs[0] = (PipeAttribute *)attribXYZ;
  this->attribs[1] = (PipeAttribute *)attribUV;
  this->attribs[2] = (PipeAttribute *)attribRGBA;
  this->attribs[3] = (PipeAttribute *)attribNormal;
  this->attribs[4] = (PipeAttribute *)attribWeights;
  bufferSize = MatPipeline::getVertCount(0x2d0,5,3,2);
  MatPipeline::setTriBufferSizes(this,5,bufferSize);
  this->vifOffset = this->inputStride * bufferSize;
  this->instanceCB = skinInstanceCB;
  this->uninstanceCB = genericUninstanceCB;
  this->preUninstCB = skinPreCB;
  this->postUninstCB = skinPostCB;
  pOVar1 = ObjPipeline::create();
  (pOVar1->super_ObjPipeline).super_Pipeline.pluginID = 0x116;
  (pOVar1->super_ObjPipeline).super_Pipeline.pluginData = 1;
  pOVar1->groupPipeline = this;
  return pOVar1;
}

Assistant:

ObjPipeline*
makeSkinPipeline(void)
{
	MatPipeline *pipe = MatPipeline::create();
	pipe->pluginID = ID_SKIN;
	pipe->pluginData = 1;
	pipe->attribs[AT_XYZ] = &attribXYZ;
	pipe->attribs[AT_UV] = &attribUV;
	pipe->attribs[AT_RGBA] = &attribRGBA;
	pipe->attribs[AT_NORMAL] = &attribNormal;
	pipe->attribs[AT_NORMAL+1] = &attribWeights;
	uint32 vertCount = MatPipeline::getVertCount(VU_Lights-0x100, 5, 3, 2);
	pipe->setTriBufferSizes(5, vertCount);
	pipe->vifOffset = pipe->inputStride*vertCount;
	pipe->instanceCB = skinInstanceCB;
	pipe->uninstanceCB = genericUninstanceCB;
	pipe->preUninstCB = skinPreCB;
	pipe->postUninstCB = skinPostCB;

	ObjPipeline *opipe = ObjPipeline::create();
	opipe->pluginID = ID_SKIN;
	opipe->pluginData = 1;
	opipe->groupPipeline = pipe;
	return opipe;
}